

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,
                            JSON<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_char>
                            *jt)

{
  JObject *pJVar1;
  ostream *poVar2;
  char local_3d [20];
  char local_29;
  JObject local_28;
  JSON<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_char>
  *local_18;
  JSON<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_char>
  *jt_local;
  ostream *os_local;
  
  local_18 = jt;
  jt_local = (JSON<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_char>
              *)os;
  JObject::JObject(&local_28,os);
  local_29 = '\0';
  pJVar1 = JObject::field<char[5],std::__cxx11::string,char>
                     (&local_28,(char (*) [5])0x1cf015,&local_18->object->first,&local_29);
  local_3d[0] = '\0';
  pJVar1 = JObject::field<char[5],int,char>
                     (pJVar1,(char (*) [5])0x1cff27,&local_18->object->second,local_3d);
  poVar2 = JObject::operator_cast_to_ostream_(pJVar1);
  JObject::~JObject(&local_28);
  return poVar2;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<std::pair<std::string, int>> &jt)
{
    return JObject(os)
        .field("file", jt.object.first)
        .field("line", jt.object.second);
}